

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::eval_mul_ivec3(ShaderEvalContext *c)

{
  VecAccess<float,_4,_3> local_70;
  undefined1 local_58 [24];
  undefined1 local_40 [24];
  tcu local_28 [12];
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_40,(int)c + 0x30,2,0);
  tcu::Vector<float,_3>::asInt((Vector<float,_3> *)(local_40 + 0xc));
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_58,(int)local_10 + 0x40,1,2);
  tcu::Vector<float,_3>::asInt((Vector<float,_3> *)(local_58 + 0xc));
  tcu::mul<int,3>(local_28,(Vector<int,_3> *)(local_40 + 0xc),(Vector<int,_3> *)(local_58 + 0xc));
  tcu::Vector<int,_3>::asFloat((Vector<int,_3> *)&local_1c);
  tcu::Vector<float,_4>::xyz(&local_70,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_70,&local_1c);
  return;
}

Assistant:

void eval_selection_int		(ShaderEvalContext& c) { c.color.x()	= (float)selection(c.in[0].z() > 0.0f,	(int)c.in[1].x(),						(int)c.in[2].y()); }